

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O0

void compute_lookaheads(void)

{
  int iVar1;
  shorts *psVar2;
  long lVar3;
  uint *local_40;
  uint *rowp;
  shorts *next;
  shorts *sp;
  uint *fp3;
  uint *fp2;
  uint *fp1;
  int n;
  int i;
  
  local_40 = LA;
  iVar1 = lookaheads[nstates];
  for (fp1._4_4_ = 0; fp1._4_4_ < iVar1; fp1._4_4_ = fp1._4_4_ + 1) {
    lVar3 = (long)tokensetsize;
    for (next = lookback[fp1._4_4_]; next != (shorts *)0x0; next = next->next) {
      fp2 = local_40;
      fp3 = F + tokensetsize * next->value;
      while (fp2 < local_40 + lVar3) {
        *fp2 = *fp3 | *fp2;
        fp3 = fp3 + 1;
        fp2 = fp2 + 1;
      }
    }
    local_40 = local_40 + lVar3;
  }
  for (fp1._4_4_ = 0; fp1._4_4_ < iVar1; fp1._4_4_ = fp1._4_4_ + 1) {
    next = lookback[fp1._4_4_];
    while (next != (shorts *)0x0) {
      psVar2 = next->next;
      free(next);
      next = psVar2;
    }
  }
  free(lookback);
  free(F);
  return;
}

Assistant:

void compute_lookaheads()
{
  register int i, n;
  register unsigned *fp1, *fp2, *fp3;
  register shorts *sp, *next;
  register unsigned *rowp;

  rowp = LA;
  n = lookaheads[nstates];
  for (i = 0; i < n; i++)
    {
      fp3 = rowp + tokensetsize;
      for (sp = lookback[i]; sp; sp = sp->next)
	{
	  fp1 = rowp;
	  fp2 = F + tokensetsize * sp->value;
	  while (fp1 < fp3)
	    *fp1++ |= *fp2++;
	}
      rowp = fp3;
    }

  for (i = 0; i < n; i++)
    for (sp = lookback[i]; sp; sp = next)
      {
        next = sp->next;
        FREE(sp);
      }

  FREE(lookback);
  FREE(F);
}